

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXAlgorithms.h
# Opt level: O1

string * __thiscall
ZXing::ToString<long_long,void>(string *__return_storage_ptr__,ZXing *this,longlong val,int len)

{
  bool bVar1;
  long *plVar2;
  ulong uVar3;
  bool bVar4;
  uint *local_70;
  long local_68;
  uint local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  uint *local_50;
  long local_48;
  uint local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  uVar3 = val & 0xffffffff;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)val);
  if ((long)this < 0) {
    plVar2 = (long *)__cxa_allocate_exception(0x30);
    local_50 = &local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Invalid value","");
    *plVar2 = (long)(plVar2 + 2);
    if (local_50 == &local_40) {
      *(uint *)(plVar2 + 2) = local_40;
      *(undefined4 *)((long)plVar2 + 0x14) = uStack_3c;
      *(undefined4 *)(plVar2 + 3) = uStack_38;
      *(undefined4 *)((long)plVar2 + 0x1c) = uStack_34;
    }
    else {
      *plVar2 = (long)local_50;
      plVar2[2] = CONCAT44(uStack_3c,local_40);
    }
    plVar2[1] = local_48;
    local_48 = 0;
    local_40 = local_40 & 0xffffff00;
    plVar2[4] = (long)"src/ZXAlgorithms.h";
    *(undefined2 *)(plVar2 + 5) = 0x70;
    *(undefined1 *)((long)plVar2 + 0x2a) = 1;
    local_50 = &local_40;
    __cxa_throw(plVar2,&Error::typeinfo,Error::~Error);
  }
  bVar4 = this != (ZXing *)0x0;
  if (bVar4 && 0 < (int)val) {
    do {
      (__return_storage_ptr__->_M_dataplus)._M_p[uVar3 - 1] =
           (char)this + (char)(ZXing *)((ulong)this / 10) * -10 | 0x30;
      bVar4 = (ZXing *)0x9 < this;
      if ((long)uVar3 < 2) break;
      uVar3 = uVar3 - 1;
      bVar1 = (ZXing *)0x9 < this;
      this = (ZXing *)((ulong)this / 10);
    } while (bVar1);
  }
  if (bVar4) {
    plVar2 = (long *)__cxa_allocate_exception(0x30);
    local_70 = &local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Invalid value","");
    *plVar2 = (long)(plVar2 + 2);
    if (local_70 == &local_60) {
      *(uint *)(plVar2 + 2) = local_60;
      *(undefined4 *)((long)plVar2 + 0x14) = uStack_5c;
      *(undefined4 *)(plVar2 + 3) = uStack_58;
      *(undefined4 *)((long)plVar2 + 0x1c) = uStack_54;
    }
    else {
      *plVar2 = (long)local_70;
      plVar2[2] = CONCAT44(uStack_5c,local_60);
    }
    plVar2[1] = local_68;
    local_68 = 0;
    local_60 = local_60 & 0xffffff00;
    plVar2[4] = (long)"src/ZXAlgorithms.h";
    *(undefined2 *)(plVar2 + 5) = 0x74;
    *(undefined1 *)((long)plVar2 + 0x2a) = 1;
    local_70 = &local_60;
    __cxa_throw(plVar2,&Error::typeinfo,Error::~Error);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(T val, int len)
{
	std::string result(len--, '0');
	if (val < 0)
		throw FormatError("Invalid value");
	for (; len >= 0 && val != 0; --len, val /= 10)
		result[len] = '0' + val % 10;
	if (val)
		throw FormatError("Invalid value");
	return result;
}